

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O2

void __thiscall deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::deinit(SRGBTestCase *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer ppSVar3;
  pointer ppSVar4;
  SRGBTestTexture *pSVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  SRGBTestSampler *pSVar8;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data;
  int iVar9;
  undefined4 extraout_var;
  size_t renderBufferIdx;
  ulong uVar11;
  long lVar12;
  ulong in_stack_ffffffffffffffb8;
  long lVar10;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar10 = CONCAT44(extraout_var,iVar9);
  data._8_8_ = 0;
  data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)in_stack_ffffffffffffffb8;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::assignData(&(this->m_framebuffer).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
               ,data);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                 *)&stack0xffffffffffffffc0);
  lVar12 = 0;
  uVar11 = 0;
  while( true ) {
    puVar1 = (this->m_renderBufferList).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->m_renderBufferList).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar2 - (long)puVar1 >> 2) <= uVar11) break;
    (**(code **)(lVar10 + 0x460))(1,(long)puVar1 + lVar12);
    uVar11 = uVar11 + 1;
    lVar12 = lVar12 + 4;
  }
  if (puVar2 != puVar1) {
    (this->m_renderBufferList).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  uVar11 = 0;
  while( true ) {
    ppSVar3 = (this->m_textureSourceList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppSVar4 = (this->m_textureSourceList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppSVar4 - (long)ppSVar3 >> 3) <= uVar11) break;
    pSVar5 = ppSVar3[uVar11];
    if (pSVar5 != (SRGBTestTexture *)0x0) {
      glu::Texture2D::~Texture2D(&pSVar5->m_source);
    }
    operator_delete(pSVar5,0xb8);
    uVar11 = uVar11 + 1;
  }
  if (ppSVar4 != ppSVar3) {
    (this->m_textureSourceList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar3;
  }
  uVar11 = 0;
  while( true ) {
    ppSVar6 = (this->m_samplerList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppSVar7 = (this->m_samplerList).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppSVar7 - (long)ppSVar6 >> 3) <= uVar11) break;
    pSVar8 = ppSVar6[uVar11];
    if (pSVar8 != (SRGBTestSampler *)0x0) {
      (*pSVar8->m_gl->deleteSamplers)(1,&pSVar8->m_samplerHandle);
    }
    operator_delete(pSVar8,0x28);
    uVar11 = uVar11 + 1;
  }
  if (ppSVar7 != ppSVar6) {
    (this->m_samplerList).
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar6;
  }
  if (this->m_vaoID != 0) {
    (**(code **)(lVar10 + 0x490))(1,&this->m_vaoID);
    this->m_vaoID = 0;
  }
  if (this->m_vertexDataID != 0) {
    (**(code **)(lVar10 + 0x438))(1,&this->m_vertexDataID);
    this->m_vertexDataID = 0;
  }
  return;
}

Assistant:

void SRGBTestCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_framebuffer	= de::MovePtr<glu::Framebuffer>(DE_NULL);

	for (std::size_t renderBufferIdx = 0; renderBufferIdx < m_renderBufferList.size(); renderBufferIdx++)
	{
		gl.deleteRenderbuffers(1, &m_renderBufferList[renderBufferIdx]);
	}
	m_renderBufferList.clear();

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		delete m_textureSourceList[textureSourceIdx];
	}
	m_textureSourceList.clear();

	for (std::size_t samplerIdx = 0; samplerIdx < m_samplerList.size(); samplerIdx++)
	{
		delete m_samplerList[samplerIdx];
	}
	m_samplerList.clear();

	if (m_vaoID != 0)
	{
		gl.deleteVertexArrays(1, &m_vaoID);
		m_vaoID = 0;
	}

	if (m_vertexDataID != 0)
	{
		gl.deleteBuffers(1, &m_vertexDataID);
		m_vertexDataID = 0;
	}
}